

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tools.cpp
# Opt level: O1

size_t JsonTools::size_of_item(string *s,size_t current,char start,char end)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  uVar2 = current + 1;
  if (uVar2 <= s->_M_string_length) {
    lVar3 = 1;
    lVar4 = 0;
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar2];
      lVar3 = (ulong)(cVar1 == start) + lVar3;
      lVar4 = (ulong)(cVar1 == end) + lVar4;
      uVar2 = uVar2 + 1;
      if (lVar3 == lVar4) break;
    } while (uVar2 <= s->_M_string_length);
  }
  return uVar2 - current;
}

Assistant:

size_t JsonTools::size_of_item(const string& s, const size_t current, const char start, const char end){
	size_t st = 1, en = 0, i = current + 1;
	while (st != en && i <= s.size()){
		if (s[i] == start) ++st;
		if (s[i] == end) ++en;
		++i;
	}
	return i - current;
}